

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall
mocker::nasm::Module::emplaceDirective<mocker::nasm::Global,char_const(&)[5]>
          (Module *this,char (*args) [5])

{
  undefined1 local_21;
  shared_ptr<mocker::nasm::Global> local_20;
  
  local_20.super___shared_ptr<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::nasm::Global,std::allocator<mocker::nasm::Global>,char_const(&)[5]>
            (&local_20.super___shared_ptr<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Global **)&local_20,(allocator<mocker::nasm::Global> *)&local_21,args);
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
  ::emplace_back<std::shared_ptr<mocker::nasm::Global>>
            ((vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
              *)this,&local_20);
  if (local_20.super___shared_ptr<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceDirective(Args &&... args) {
    directives.emplace_back(
        std::make_shared<Type>(std::forward<Args>(args)...));
  }